

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsysinfo.cpp
# Opt level: O0

QByteArray * getEtcFileContent(char *filename)

{
  int __fd;
  int iVar1;
  qint64 size;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  int fd;
  QByteArray *buffer;
  stat64 sbuf;
  mode_t in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  void *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  Initialization IVar2;
  QByteArray *this;
  stat64 local_98;
  long local_8;
  
  IVar2 = (Initialization)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  __fd = qt_safe_open((char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                      in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08);
  if (__fd == -1) {
    QByteArray::QByteArray((QByteArray *)0x25c935);
  }
  else {
    memset(&local_98,0xaa,0x90);
    iVar1 = fstat64(__fd,&local_98);
    if (iVar1 == -1) {
      qt_safe_close(in_stack_ffffffffffffff14);
      QByteArray::QByteArray((QByteArray *)0x25c974);
    }
    else {
      (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      (in_RDI->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
      QByteArray::QByteArray(this,(qsizetype)in_RDI,IVar2);
      QByteArray::data((QByteArray *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      size = qt_safe_read(__fd,in_stack_ffffffffffffff18,
                          CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      QByteArray::resize((QByteArray *)CONCAT44(__fd,in_stack_ffffffffffffff20),size);
      qt_safe_close(in_stack_ffffffffffffff14);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

static QByteArray getEtcFileContent(const char *filename)
{
    // we're avoiding QFile here
    int fd = qt_safe_open(filename, O_RDONLY);
    if (fd == -1)
        return QByteArray();

    QT_STATBUF sbuf;
    if (QT_FSTAT(fd, &sbuf) == -1) {
        qt_safe_close(fd);
        return QByteArray();
    }

    QByteArray buffer(sbuf.st_size, Qt::Uninitialized);
    buffer.resize(qt_safe_read(fd, buffer.data(), sbuf.st_size));
    qt_safe_close(fd);
    return buffer;
}